

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

bool __thiscall kratos::Param::has_param_size_var(Param *this,Var *var,uint32_t index,Var *expr)

{
  const_iterator cVar1;
  undefined1 local_28 [8];
  tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*> tuple;
  
  local_28 = (undefined1  [8])expr;
  tuple.super__Tuple_impl<0UL,_kratos::Var_*,_unsigned_int,_kratos::Var_*>.
  super__Tuple_impl<1UL,_unsigned_int,_kratos::Var_*>.super__Tuple_impl<2UL,_kratos::Var_*>.
  super__Head_base<2UL,_kratos::Var_*,_false>._M_head_impl._0_4_ = index;
  tuple.super__Tuple_impl<0UL,_kratos::Var_*,_unsigned_int,_kratos::Var_*>.
  super__Tuple_impl<1UL,_unsigned_int,_kratos::Var_*>._8_8_ = var;
  cVar1 = std::
          _Rb_tree<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>,_std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>,_std::_Identity<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>,_std::less<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>,_std::allocator<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>_>
          ::find(&(this->param_vars_size_)._M_t,(key_type *)local_28);
  return (_Rb_tree_header *)cVar1._M_node !=
         &(this->param_vars_size_)._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool Param::has_param_size_var(kratos::Var *var, uint32_t index, kratos::Var *expr) const {
    auto tuple = std::make_tuple(var, index, expr);
    return param_vars_size_.find(tuple) != param_vars_size_.end();
}